

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *psVar2;
  u16 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  sqlite3_io_methods *psVar9;
  char **ppcVar10;
  char *pcVar11;
  ulong uVar12;
  size_t sVar13;
  unixShmNode *puVar14;
  sqlite3_mutex *psVar15;
  ulong uVar16;
  sqlite3_uint64 sVar17;
  unixShmNode *zBuf;
  int iVar18;
  long lVar19;
  int local_ec;
  short local_d8;
  int local_c4;
  stat sStat;
  
  uVar4 = (*aSyscall[0x19].pCurrent)();
  uVar8 = 1;
  if (0x7fff < (int)uVar4) {
    uVar8 = (ulong)(uVar4 >> 0xf);
  }
  psVar9 = fd[8].pMethods;
  if (psVar9 == (sqlite3_io_methods *)0x0) {
    psVar9 = (sqlite3_io_methods *)sqlite3_malloc64(0x18);
    if (psVar9 == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    psVar9->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    *(undefined8 *)psVar9 = 0;
    psVar9->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    psVar1 = fd[2].pMethods;
    puVar14 = (unixShmNode *)psVar1->xLock;
    local_ec = 0;
    if (puVar14 != (unixShmNode *)0x0) goto LAB_0012d92b;
    psVar2 = fd[7].pMethods;
    iVar7 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
    iVar5 = 0x70a;
    if (iVar7 == 0) {
      sVar13 = strlen((char *)psVar2);
      sVar17 = (long)(int)sVar13 + 0x46;
      puVar14 = (unixShmNode *)sqlite3_malloc64(sVar17);
      iVar5 = 7;
      if (puVar14 == (unixShmNode *)0x0) goto LAB_0012da79;
      local_ec = 0;
      memset(puVar14,0,sVar17);
      zBuf = puVar14 + 1;
      puVar14->zFilename = (char *)zBuf;
      sqlite3_snprintf((int)sVar13 + 6,(char *)zBuf,"%s-shm",psVar2);
      puVar14->hShm = -1;
      psVar2 = fd[2].pMethods;
      psVar2->xLock = (_func_int_sqlite3_file_ptr_int *)puVar14;
      puVar14->pInode = (unixInodeInfo *)psVar2;
      if (sqlite3Config.bCoreMutex != 0) {
        psVar15 = sqlite3_mutex_alloc(0);
        puVar14->pShmMutex = psVar15;
        if (psVar15 == (sqlite3_mutex *)0x0) goto LAB_0012da79;
      }
      if (*(char *)((long)&psVar1->xTruncate + 1) == '\0') {
        iVar5 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
        if (iVar5 == 0) {
          uVar4 = robust_open((char *)zBuf,0x42,sStat.st_mode & 0x1ff);
          puVar14->hShm = uVar4;
        }
        else {
          uVar4 = puVar14->hShm;
        }
        if ((int)uVar4 < 0) {
          uVar4 = robust_open((char *)zBuf,0,sStat.st_mode & 0x1ff);
          puVar14->hShm = uVar4;
          if ((int)uVar4 < 0) {
            iVar5 = sqlite3CantopenError(0x90d5);
            unixLogErrorAtLine(iVar5,"open",(char *)zBuf,0x90d5);
            goto LAB_0012da79;
          }
          puVar14->isReadonly = '\x01';
        }
        iVar5 = (*aSyscall[0x15].pCurrent)();
        if (iVar5 == 0) {
          (*aSyscall[0x14].pCurrent)((ulong)uVar4,(ulong)sStat.st_uid,(ulong)sStat.st_gid);
        }
        local_ec = unixLockSharedMemory((unixFile *)fd,puVar14);
        if ((local_ec != 0x508) && (iVar5 = local_ec, local_ec != 0)) goto LAB_0012da79;
      }
LAB_0012d92b:
      *(unixShmNode **)psVar9 = puVar14;
      puVar14->nRef = puVar14->nRef + 1;
      fd[8].pMethods = psVar9;
      if (unixBigLock != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
      }
      if (puVar14->pShmMutex == (sqlite3_mutex *)0x0) {
        psVar15 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(puVar14->pShmMutex);
        psVar15 = puVar14->pShmMutex;
      }
      psVar9->xClose = (_func_int_sqlite3_file_ptr *)puVar14->pFirst;
      puVar14->pFirst = (unixShm *)psVar9;
      if (psVar15 != (sqlite3_mutex *)0x0) goto LAB_0012dab2;
    }
    else {
LAB_0012da79:
      local_ec = iVar5;
      unixShmPurge((unixFile *)fd);
      sqlite3_free(psVar9);
      psVar15 = unixBigLock;
      if (unixBigLock == (sqlite3_mutex *)0x0) {
        return local_ec;
      }
LAB_0012dab2:
      (*sqlite3Config.mutex.xMutexLeave)(psVar15);
    }
    if (local_ec != 0) {
      return local_ec;
    }
    psVar9 = fd[8].pMethods;
  }
  puVar14 = *(unixShmNode **)psVar9;
  if (puVar14->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(puVar14->pShmMutex);
  }
  if (puVar14->isUnlocked != '\0') {
    iVar5 = unixLockSharedMemory((unixFile *)fd,puVar14);
    if (iVar5 != 0) goto LAB_0012dc01;
    puVar14->isUnlocked = '\0';
  }
  iVar7 = (int)uVar8;
  iVar18 = (iVar7 + iRegion) - (iVar7 + iRegion) % iVar7;
  iVar5 = 0;
  if (iVar18 <= (int)(uint)puVar14->nRegion) goto LAB_0012dc01;
  puVar14->szRegion = szRegion;
  if (puVar14->hShm < 0) goto LAB_0012d973;
  iVar6 = (*aSyscall[5].pCurrent)((ulong)(uint)puVar14->hShm,&sStat);
  iVar5 = 0x130a;
  if (iVar6 != 0) goto LAB_0012dc01;
  if (sStat.st_size < iVar18 * szRegion) {
    if (bExtend != 0) {
      lVar19 = (long)(int)(sStat.st_size / 0x1000);
      uVar16 = lVar19 << 0xc | 0xfff;
      for (; lVar19 < (iVar18 * szRegion) / 0x1000; lVar19 = lVar19 + 1) {
        iVar5 = seekAndWriteFd(puVar14->hShm,uVar16,"",1,&local_c4);
        if (iVar5 != 1) {
          unixLogErrorAtLine(0x130a,"write",puVar14->zFilename,0x9165);
          iVar5 = 0x130a;
          goto LAB_0012dc01;
        }
        uVar16 = uVar16 + 0x1000;
      }
      goto LAB_0012d973;
    }
  }
  else {
LAB_0012d973:
    ppcVar10 = (char **)sqlite3_realloc(puVar14->apRegion,iVar18 * 8);
    if (ppcVar10 == (char **)0x0) {
      iVar5 = 0xc0a;
      goto LAB_0012dc01;
    }
    puVar14->apRegion = ppcVar10;
    sVar17 = (sqlite3_uint64)(iVar7 * szRegion);
    uVar16 = uVar8;
    if (iVar7 == 0) {
      uVar16 = 0;
    }
    uVar3 = puVar14->nRegion;
    while ((int)(uint)uVar3 < iVar18) {
      if (puVar14->hShm < 0) {
        pcVar11 = (char *)sqlite3_malloc64(sVar17);
        if (pcVar11 == (char *)0x0) {
          iVar5 = 7;
          goto LAB_0012dc01;
        }
        memset(pcVar11,0,sVar17);
      }
      else {
        pcVar11 = (char *)(*aSyscall[0x16].pCurrent)
                                    (0,sVar17,(ulong)((uint)(puVar14->isReadonly == '\0') * 2 + 1),1
                                     ,(ulong)(uint)puVar14->hShm,(ulong)uVar3 * (long)szRegion);
        if (pcVar11 == (char *)0xffffffffffffffff) {
          unixLogErrorAtLine(0x150a,"mmap",puVar14->zFilename,0x9180);
          iVar5 = 0x150a;
          goto LAB_0012dc01;
        }
      }
      for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        puVar14->apRegion[(uint)puVar14->nRegion + (int)uVar12] = pcVar11;
        pcVar11 = pcVar11 + szRegion;
      }
      local_d8 = (short)uVar8;
      uVar3 = puVar14->nRegion + local_d8;
      puVar14->nRegion = uVar3;
    }
  }
  iVar5 = 0;
LAB_0012dc01:
  if (iRegion < (int)(uint)puVar14->nRegion) {
    pcVar11 = puVar14->apRegion[iRegion];
  }
  else {
    pcVar11 = (char *)0x0;
  }
  *pp = pcVar11;
  iVar7 = 8;
  if (puVar14->isReadonly == '\0') {
    iVar7 = iVar5;
  }
  if (iVar5 != 0) {
    iVar7 = iVar5;
  }
  if (puVar14->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar14->pShmMutex);
  }
  return iVar7;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( pShmNode->isUnlocked ){
    rc = unixLockSharedMemory(pDbFd, pShmNode);
    if( rc!=SQLITE_OK ) goto shmpage_out;
    pShmNode->isUnlocked = 0;
  }
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->hShm>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->hShm, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->hShm, iPg*pgsz + pgsz-1,"",1,&x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->hShm>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->hShm, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(nMap);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, nMap);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  return rc;
}